

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O3

pair<bool,_bool> __thiscall
spvtools::opt::UpgradeMemoryModel::CheckAllTypes(UpgradeMemoryModel *this,Instruction *inst)

{
  IRContext *pIVar1;
  bool bVar2;
  uint32_t uVar3;
  int32_t iVar4;
  DefUseManager *pDVar5;
  uint uVar6;
  bool bVar7;
  pair<bool,_bool> pVar8;
  uint uVar9;
  ulong uVar10;
  pair<std::__detail::_Node_iterator<const_spvtools::opt::Instruction_*,_true,_false>,_bool> pVar11;
  Instruction *def;
  vector<const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>_>
  stack;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  visited;
  Instruction *local_a0;
  Instruction *local_98;
  uint local_8c;
  void *local_88;
  void *pvStack_80;
  long local_78;
  Instruction *local_70;
  undefined1 local_68 [40];
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = (Instruction *)0x1;
  local_68._16_8_ = (Instruction *)0x0;
  local_68._24_8_ = 0;
  local_68._32_4_ = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_88 = (void *)0x0;
  pvStack_80 = (void *)0x0;
  local_78 = 0;
  pVar8.first = false;
  pVar8.second = false;
  local_70 = inst;
  std::vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>::
  _M_realloc_insert<spvtools::opt::Instruction_const*const&>
            ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
              *)&local_88,(iterator)0x0,&local_70);
  if (local_88 != pvStack_80) {
    uVar10 = 0;
    bVar7 = false;
    do {
      local_98 = (Instruction *)local_68;
      local_a0 = *(Instruction **)((long)pvStack_80 + -8);
      pvStack_80 = (void *)((long)pvStack_80 + -8);
      pVar11 = std::
               _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
               ::
               _M_insert<spvtools::opt::Instruction_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction_const*,false>>>>
                         ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           *)local_98,&local_a0,&local_98);
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (local_a0->opcode_ == OpTypeStruct) {
          bVar2 = HasDecoration(this,local_a0,0xffffffff,Coherent);
          bVar7 = (bool)(bVar7 | bVar2);
          bVar2 = HasDecoration(this,local_a0,0xffffffff,Volatile);
          bVar2 = (bool)((byte)uVar10 | bVar2);
          uVar10 = CONCAT71((int7)(uVar10 >> 8),bVar2);
          if ((bVar2 != false & bVar7) != 0) {
            pVar8.second = bVar2;
            pVar8.first = bVar7;
            goto LAB_001b11dd;
          }
          uVar9 = (local_a0->has_result_id_ & 1) + 1;
          if (local_a0->has_type_id_ == false) {
            uVar9 = (uint)local_a0->has_result_id_;
          }
          if (uVar9 != (int)((ulong)((long)(local_a0->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_a0->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x55555555) {
            local_8c = (uint)uVar10;
            uVar9 = 0;
            do {
              pIVar1 = (this->super_Pass).context_;
              if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                IRContext::BuildDefUseManager(pIVar1);
              }
              pDVar5 = (pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl;
              uVar6 = (local_a0->has_result_id_ & 1) + 1;
              if (local_a0->has_type_id_ == false) {
                uVar6 = (uint)local_a0->has_result_id_;
              }
              uVar3 = Instruction::GetSingleWordOperand(local_a0,uVar6 + uVar9);
              local_98 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
              std::
              vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
              ::emplace_back<spvtools::opt::Instruction_const*>
                        ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                          *)&local_88,&local_98);
              uVar9 = uVar9 + 1;
              uVar6 = (local_a0->has_result_id_ & 1) + 1;
              if (local_a0->has_type_id_ == false) {
                uVar6 = (uint)local_a0->has_result_id_;
              }
            } while (uVar9 < (int)((ulong)((long)(local_a0->operands_).
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(local_a0->operands_).
                                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0x55555555 - uVar6);
            uVar10 = (ulong)local_8c;
          }
        }
        else {
          iVar4 = spvOpcodeIsComposite(local_a0->opcode_);
          if (iVar4 == 0) {
            if (local_a0->opcode_ != OpTypePointer) goto LAB_001b11a7;
            pIVar1 = (this->super_Pass).context_;
            if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar1);
            }
            pDVar5 = (pIVar1->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar9 = (local_a0->has_result_id_ & 1) + 1;
            if (local_a0->has_type_id_ == false) {
              uVar9 = (uint)local_a0->has_result_id_;
            }
            uVar3 = uVar9 + 1;
          }
          else {
            pIVar1 = (this->super_Pass).context_;
            if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager(pIVar1);
            }
            pDVar5 = (pIVar1->def_use_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                     _M_head_impl;
            uVar3 = (local_a0->has_result_id_ & 1) + 1;
            if (local_a0->has_type_id_ == false) {
              uVar3 = (uint)local_a0->has_result_id_;
            }
          }
          uVar3 = Instruction::GetSingleWordOperand(local_a0,uVar3);
          local_98 = analysis::DefUseManager::GetDef(pDVar5,uVar3);
          std::
          vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
          ::emplace_back<spvtools::opt::Instruction_const*>
                    ((vector<spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>>
                      *)&local_88,&local_98);
        }
      }
LAB_001b11a7:
    } while (local_88 != pvStack_80);
    pVar8 = (pair<bool,_bool>)((ushort)bVar7 | (ushort)(((uint)uVar10 & 0xff) << 8));
  }
LAB_001b11dd:
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  std::
  _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return pVar8;
}

Assistant:

std::pair<bool, bool> UpgradeMemoryModel::CheckAllTypes(
    const Instruction* inst) {
  std::unordered_set<const Instruction*> visited;
  std::vector<const Instruction*> stack;
  stack.push_back(inst);

  bool is_coherent = false;
  bool is_volatile = false;
  while (!stack.empty()) {
    const Instruction* def = stack.back();
    stack.pop_back();

    if (!visited.insert(def).second) continue;

    if (def->opcode() == spv::Op::OpTypeStruct) {
      // Any member decorated with coherent and/or volatile is enough to have
      // the related operation be flagged as coherent and/or volatile.
      is_coherent |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Coherent);
      is_volatile |= HasDecoration(def, std::numeric_limits<uint32_t>::max(),
                                   spv::Decoration::Volatile);
      if (is_coherent && is_volatile)
        return std::make_pair(is_coherent, is_volatile);

      // Check the subtypes.
      for (uint32_t i = 0; i < def->NumInOperands(); ++i) {
        stack.push_back(context()->get_def_use_mgr()->GetDef(
            def->GetSingleWordInOperand(i)));
      }
    } else if (spvOpcodeIsComposite(def->opcode())) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(0u)));
    } else if (def->opcode() == spv::Op::OpTypePointer) {
      stack.push_back(context()->get_def_use_mgr()->GetDef(
          def->GetSingleWordInOperand(1u)));
    }
  }

  return std::make_pair(is_coherent, is_volatile);
}